

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O3

Ray * __thiscall
ThinLensCamera::generateRay
          (Ray *__return_storage_ptr__,ThinLensCamera *this,int x,int y,mt19937 *rng)

{
  Vector3f *v;
  Vector3f *v0;
  Vector3f *v2;
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  result_type rVar4;
  float f;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_ZMM2 [64];
  undefined4 in_XMM3_Da;
  undefined4 in_XMM3_Db;
  undefined8 in_XMM3_Qb;
  Vector3f df;
  Vector3f g;
  Vector3f local_f0;
  Vector3f local_e4;
  Vector3f local_d8;
  Vector3f local_cc [2];
  Vector3f local_b4;
  undefined1 local_a8 [24];
  Vector3f local_90;
  Matrix3f local_84;
  undefined1 local_60 [12];
  Matrix3f local_54;
  
  auVar16 = in_ZMM2._0_16_;
  auVar14 = in_ZMM1._0_16_;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rng);
  auVar14 = vcvtusi2sd_avx512f(auVar14,rVar4);
  auVar6._0_8_ = auVar14._0_8_ / 4294967295.0;
  auVar6._8_8_ = auVar14._8_8_;
  auVar7._0_4_ = (float)auVar6._0_8_;
  auVar7._4_12_ = auVar6._4_12_;
  auVar14 = vsqrtss_avx(auVar7,auVar7);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rng);
  iVar1 = (this->super_Camera).width;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = (double)auVar14._0_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (double)x;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = 0.5 - (double)((uint)rVar4 & 1);
  auVar2 = vfmadd213sd_fma(auVar8,auVar15,auVar14);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rng);
  auVar14 = vcvtusi2sd_avx512f(auVar16,rVar4);
  auVar9._0_8_ = auVar14._0_8_ / 4294967295.0;
  auVar9._8_8_ = auVar14._8_8_;
  auVar10._0_4_ = (float)auVar9._0_8_;
  auVar10._4_12_ = auVar9._4_12_;
  auVar14 = vsqrtss_avx(auVar10,auVar10);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rng);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = (double)auVar14._0_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = (double)y;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = 0.5 - (double)((uint)rVar4 & 1);
  auVar14 = vfmadd213sd_fma(auVar11,auVar17,auVar16);
  Vector3f::Vector3f(&local_d8,(float)(auVar2._0_8_ - (double)((float)(iVar1 + -1) * 0.5)),
                     (float)(auVar14._0_8_ -
                            (double)((float)((this->super_Camera).height + -1) * 0.5)),this->dist);
  Vector3f::normalize(&local_d8);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rng);
  auVar2._4_4_ = in_XMM3_Db;
  auVar2._0_4_ = in_XMM3_Da;
  auVar2._8_8_ = in_XMM3_Qb;
  auVar14 = vcvtusi2sd_avx512f(auVar2,rVar4);
  v = &(this->super_Camera).up;
  fVar5 = (float)(auVar14._0_8_ / 4294967295.0) * 6.2831855;
  f = cosf(fVar5);
  ::operator*((Vector3f *)&local_84,f);
  v0 = &(this->super_Camera).horizontal;
  fVar5 = sinf(fVar5);
  ::operator*((Vector3f *)(local_60 + 0xc),fVar5);
  operator+((Vector3f *)&local_84,(Vector3f *)(local_60 + 0xc));
  fVar5 = this->radius;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rng);
  auVar3._4_4_ = in_XMM3_Db;
  auVar3._0_4_ = in_XMM3_Da;
  auVar3._8_8_ = in_XMM3_Qb;
  auVar14 = vcvtusi2sd_avx512f(auVar3,rVar4);
  auVar12._0_8_ = auVar14._0_8_ / 4294967295.0;
  auVar12._8_8_ = auVar14._8_8_;
  auVar13._0_4_ = (float)auVar12._0_8_;
  auVar13._4_12_ = auVar12._4_12_;
  auVar14 = vsqrtss_avx(auVar13,auVar13);
  Vector3f::operator*=(&local_f0,auVar14._0_4_ * fVar5);
  operator-(v);
  v2 = &(this->super_Camera).direction;
  Matrix3f::Matrix3f(&local_84,v0,&local_90,v2,true);
  ::operator*((Matrix3f *)local_60,(Vector3f *)&local_84);
  operator+(&(this->super_Camera).center,(Vector3f *)local_60);
  operator-(v);
  Matrix3f::Matrix3f((Matrix3f *)(local_60 + 0xc),v0,&local_b4,v2,true);
  ::operator*(local_cc,this->length);
  operator-(local_cc,&local_f0);
  ::operator*((Matrix3f *)local_a8,(Vector3f *)(local_60 + 0xc));
  Vector3f::normalized((Vector3f *)local_a8);
  Vector3f::Vector3f(&__return_storage_ptr__->o,&local_e4);
  Vector3f::Vector3f(&__return_storage_ptr__->d,(Vector3f *)(local_a8 + 0xc));
  __return_storage_ptr__->tmax = 3.4028235e+38;
  return __return_storage_ptr__;
}

Assistant:

Ray generateRay(int x, int y, RNG_TYPE& rng) const override {
		Vector3f g(x + sqrtf(randf(rng)) * (0.5 - rng() % 2) - (width - 1) / 2.0f,
			y + sqrtf(randf(rng)) * (0.5 - rng() % 2) - (height - 1) / 2.0f, dist);
		//Vector3f g((x+randf(rng)-0.5 - (width - 1) / 2.0f), (y+randf(rng)-0.5 - (height - 1) / 2.0f), dist);
		g.normalize();
		float a = randf(rng) * (2 * PI);
		Vector3f df = up * cosf(a) + horizontal * sinf(a); df *= radius*sqrtf(randf(rng));
		return Ray(center + (Matrix3f(horizontal, -up, direction, 1)*df), (Matrix3f(horizontal, -up, direction, 1) *
			(g * length - df)).normalized());
	}